

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O0

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info
          (dwarf_resolver *this,die_object *cu_die,Dwarf_Addr pc,stacktrace_frame *frame)

{
  dwarf_resolver *this_00;
  source_location location;
  source_location location_00;
  source_location location_01;
  source_location location_02;
  source_location location_03;
  source_location location_04;
  source_location location_05;
  source_location location_06;
  source_location location_07;
  bool bVar1;
  cache_mode cVar2;
  int iVar3;
  skeleton_info *psVar4;
  reference_wrapper<cpptrace::detail::libdwarf::line_table_info> *this_01;
  line_table_info *plVar5;
  pointer plVar6;
  uint *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  char *in_stack_fffffffffffffcd8;
  longlong **args_4;
  undefined8 in_stack_fffffffffffffce0;
  source_location local_268;
  int *local_258;
  int local_24c;
  dwarf_resolver *pdStack_248;
  Dwarf_Bool is_line_end;
  undefined1 local_240 [8];
  raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:817:29),_0,_0,_0>
  wrapper_1;
  char **local_218;
  char *local_210;
  char *filename_1;
  unsigned_long_long *local_1f8;
  unsigned_long_long local_1f0;
  Dwarf_Unsigned line_number_1;
  stacktrace_frame **local_1d8;
  stacktrace_frame *local_1d0;
  Dwarf_Addr lineaddr_1;
  Dwarf_Line line_2;
  Dwarf_Line_s *pDStack_1b8;
  int j;
  Dwarf_Line found_line;
  stacktrace_frame **local_1a0;
  stacktrace_frame *local_198;
  Dwarf_Addr lineaddr;
  Dwarf_Line line_1;
  Dwarf_Line_s *pDStack_180;
  int i;
  Dwarf_Line last_line;
  Dwarf_Addr last_lineaddr;
  longlong *local_160;
  Dwarf_Line_s ***local_158;
  Dwarf_Line **local_150;
  Dwarf_Line_s ***local_148;
  longlong local_140;
  Dwarf_Signed linecount_actuals;
  Dwarf_Line *linebuf_actuals;
  Dwarf_Signed line_count;
  Dwarf_Line *line_buffer;
  Dwarf_Line_Context line_context;
  undefined1 local_110 [8];
  raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:764:29),_0,_0,_0>
  wrapper;
  char **local_e8;
  char *local_e0;
  char *filename;
  source_location local_d0;
  unsigned_long_long *local_c0;
  unsigned_long_long local_b8;
  Dwarf_Unsigned column_number;
  source_location local_a8;
  unsigned_long_long *local_98;
  unsigned_long_long local_90;
  Dwarf_Unsigned line_number;
  Dwarf_Line line;
  line_entry *local_70;
  line_entry *local_68;
  __normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
  local_60;
  __normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
  table_it;
  vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
  *line_entries;
  line_table_info *table_info;
  undefined1 local_38 [8];
  optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0> table_info_opt;
  stacktrace_frame *frame_local;
  Dwarf_Addr pc_local;
  die_object *cu_die_local;
  dwarf_resolver *this_local;
  
  table_info_opt._8_8_ = frame;
  frame_local = (stacktrace_frame *)pc;
  pc_local = (Dwarf_Addr)cu_die;
  cu_die_local = (die_object *)this;
  bVar1 = detail::optional::operator_cast_to_bool((optional *)&this->skeleton);
  if (bVar1) {
    psVar4 = optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(&this->skeleton);
    this_00 = psVar4->resolver;
    psVar4 = optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(&this->skeleton);
    retrieve_line_info(this_00,&psVar4->cu_die,(Dwarf_Addr)frame_local,
                       (stacktrace_frame *)table_info_opt._8_8_);
  }
  else {
    get_line_table((dwarf_resolver *)local_38,(die_object *)this);
    bVar1 = detail::optional::operator_cast_to_bool((optional *)local_38);
    if (bVar1) {
      this_01 = optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>::
                unwrap((optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>
                        *)local_38);
      plVar5 = std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>::get(this_01);
      cVar2 = get_cache_mode();
      if (cVar2 == prioritize_speed) {
        table_it._M_current = (line_entry *)&plVar5->line_entries;
        local_68 = (line_entry *)
                   std::
                   vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                   ::begin((vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                            *)table_it._M_current);
        local_70 = (line_entry *)
                   std::
                   vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                   ::end(table_it._M_current);
        local_60 = first_less_than_or_equal<__gnu_cxx::__normal_iterator<cpptrace::detail::libdwarf::line_entry*,std::vector<cpptrace::detail::libdwarf::line_entry,std::allocator<cpptrace::detail::libdwarf::line_entry>>>,unsigned_long_long,cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(cpptrace::detail::libdwarf::die_object_const&,unsigned_long_long,cpptrace::stacktrace_frame&)::_lambda(unsigned_long_long,cpptrace::detail::libdwarf::line_entry_const&)_1_>
                             (local_68,local_70,&frame_local);
        line = (Dwarf_Line)
               std::
               vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
               ::end((vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>
                      *)table_it._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_60,
                           (__normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
                            *)&line);
        if (bVar1) {
          plVar6 = __gnu_cxx::
                   __normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
                   ::operator->(&local_60);
          line_number = (Dwarf_Unsigned)plVar6->line;
          plVar6 = __gnu_cxx::
                   __normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
                   ::operator->(&local_60);
          bVar1 = detail::optional::operator_cast_to_bool((optional *)&plVar6->line_number);
          if (!bVar1) {
            local_90 = 0;
            local_98 = &local_90;
            iVar3 = wrap<Dwarf_Line_s_*,_unsigned_long_long_*,_Dwarf_Error_s_**,_Dwarf_Line_s_*&,_unsigned_long_long_*,_0>
                              (this,dwarf_lineno,(Dwarf_Line_s **)&line_number,&local_98);
            source_location::source_location
                      (&local_a8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                       ,0x2eb);
            location._8_8_ = in_stack_fffffffffffffce0;
            location.file = in_stack_fffffffffffffcd8;
            assert_impl<bool>((detail *)(ulong)(iVar3 == 0),true,0x33e770,
                              "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                              ,local_a8.file,location);
            column_number._4_4_ = (undefined4)local_90;
            plVar6 = __gnu_cxx::
                     __normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
                     ::operator->(&local_60);
            optional<unsigned_int,_0>::operator=<unsigned_int,_0>
                      (&plVar6->line_number,(uint *)((long)&column_number + 4));
          }
          plVar6 = __gnu_cxx::
                   __normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
                   ::operator->(&local_60);
          puVar7 = optional<unsigned_int,_0>::unwrap(&plVar6->line_number);
          nullable<unsigned_int,_0>::operator=
                    ((nullable<unsigned_int,_0> *)(table_info_opt._8_8_ + 0x10),*puVar7);
          plVar6 = __gnu_cxx::
                   __normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
                   ::operator->(&local_60);
          bVar1 = detail::optional::operator_cast_to_bool((optional *)&plVar6->column_number);
          if (!bVar1) {
            local_b8 = 0;
            local_c0 = &local_b8;
            iVar3 = wrap<Dwarf_Line_s_*,_unsigned_long_long_*,_Dwarf_Error_s_**,_Dwarf_Line_s_*&,_unsigned_long_long_*,_0>
                              (this,dwarf_lineoff_b,(Dwarf_Line_s **)&line_number,&local_c0);
            source_location::source_location
                      (&local_d0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                       ,0x2f2);
            location_00._8_8_ = in_stack_fffffffffffffce0;
            location_00.file = in_stack_fffffffffffffcd8;
            assert_impl<bool>((detail *)(ulong)(iVar3 == 0),true,0x33e81c,
                              "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                              ,local_d0.file,location_00);
            filename._4_4_ = (undefined4)local_b8;
            plVar6 = __gnu_cxx::
                     __normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
                     ::operator->(&local_60);
            optional<unsigned_int,_0>::operator=<unsigned_int,_0>
                      (&plVar6->column_number,(uint *)((long)&filename + 4));
          }
          plVar6 = __gnu_cxx::
                   __normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
                   ::operator->(&local_60);
          puVar7 = optional<unsigned_int,_0>::unwrap(&plVar6->column_number);
          nullable<unsigned_int,_0>::operator=
                    ((nullable<unsigned_int,_0> *)(table_info_opt._8_8_ + 0x14),*puVar7);
          plVar6 = __gnu_cxx::
                   __normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
                   ::operator->(&local_60);
          bVar1 = detail::optional::operator_cast_to_bool((optional *)&plVar6->path);
          if (!bVar1) {
            local_e0 = (char *)0x0;
            local_e8 = &local_e0;
            iVar3 = wrap<Dwarf_Line_s_*,_char_**,_Dwarf_Error_s_**,_Dwarf_Line_s_*&,_char_**,_0>
                              (this,dwarf_linesrc,(Dwarf_Line_s **)&line_number,&local_e8);
            source_location::source_location
                      ((source_location *)&wrapper.deleter.holds_value,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                       ,0x2f9);
            location_01._8_8_ = in_stack_fffffffffffffce0;
            location_01.file = in_stack_fffffffffffffcd8;
            assert_impl<bool>((detail *)(ulong)(iVar3 == 0),true,0x33e855,
                              "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                              ,(char *)wrapper.deleter._8_8_,location_01);
            line_context = (Dwarf_Line_Context)this;
            raii_wrap<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:764:29),_0,_0>
                      ((raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:764:29),_0,_0,_0>
                        *)local_110,local_e0,(anon_class_8_1_8991fb9c_for_uvalue)this);
            plVar6 = __gnu_cxx::
                     __normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
                     ::operator->(&local_60);
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ::operator=<char_*&,_0>(&plVar6->path,&local_e0);
            raii_wrapper<char_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:764:29),_0,_0,_0>
            ::~raii_wrapper((raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:764:29),_0,_0,_0>
                             *)local_110);
          }
          plVar6 = __gnu_cxx::
                   __normal_iterator<cpptrace::detail::libdwarf::line_entry_*,_std::vector<cpptrace::detail::libdwarf::line_entry,_std::allocator<cpptrace::detail::libdwarf::line_entry>_>_>
                   ::operator->(&local_60);
          __str = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ::unwrap(&plVar6->path);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (table_info_opt._8_8_ + 0x18),__str);
        }
      }
      else {
        line_buffer = (Dwarf_Line *)plVar5->line_context;
        line_count = 0;
        linebuf_actuals = (Dwarf_Line *)0x0;
        linecount_actuals = 0;
        local_140 = 0;
        local_148 = (Dwarf_Line_s ***)&line_count;
        local_150 = &linebuf_actuals;
        local_158 = (Dwarf_Line_s ***)&linecount_actuals;
        local_160 = &local_140;
        args_4 = &local_160;
        iVar3 = wrap<Dwarf_Line_Context_s_*,_Dwarf_Line_s_***,_long_long_*,_Dwarf_Line_s_***,_long_long_*,_Dwarf_Error_s_**,_Dwarf_Line_Context_s_*&,_Dwarf_Line_s_***,_long_long_*,_Dwarf_Line_s_***,_long_long_*,_0>
                          (this,dwarf_srclines_two_level_from_linecontext,
                           (Dwarf_Line_Context_s **)&line_buffer,&local_148,(longlong **)&local_150,
                           &local_158,args_4);
        source_location::source_location
                  ((source_location *)&last_lineaddr,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                   ,0x312);
        location_02._8_8_ = in_stack_fffffffffffffce0;
        location_02.file = (char *)args_4;
        assert_impl<bool>((detail *)(ulong)(iVar3 == 0),true,0x33e887,
                          "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                          ,(char *)last_lineaddr,location_02);
        last_line = (Dwarf_Line)0x0;
        pDStack_180 = (Dwarf_Line_s *)0x0;
        for (line_1._4_4_ = 0; (long)line_1._4_4_ < (long)linebuf_actuals;
            line_1._4_4_ = line_1._4_4_ + 1) {
          lineaddr = *(Dwarf_Addr *)(line_count + (long)line_1._4_4_ * 8);
          local_198 = (stacktrace_frame *)0x0;
          local_1a0 = &local_198;
          iVar3 = wrap<Dwarf_Line_s_*,_unsigned_long_long_*,_Dwarf_Error_s_**,_Dwarf_Line_s_*&,_unsigned_long_long_*,_0>
                            (this,dwarf_lineaddr,(Dwarf_Line_s **)&lineaddr,
                             (unsigned_long_long **)&local_1a0);
          source_location::source_location
                    ((source_location *)&found_line,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                     ,0x318);
          location_03._8_8_ = in_stack_fffffffffffffce0;
          location_03.file = (char *)args_4;
          assert_impl<bool>((detail *)(ulong)(iVar3 == 0),true,0x33e915,
                            "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                            ,(char *)found_line,location_03);
          pDStack_1b8 = (Dwarf_Line_s *)0x0;
          if (frame_local == local_198) {
            pDStack_1b8 = (Dwarf_Line_s *)lineaddr;
            line_2._4_4_ = line_1._4_4_;
            while (line_2._4_4_ = line_2._4_4_ + 1, (long)line_2._4_4_ < (long)linebuf_actuals) {
              lineaddr_1 = *(Dwarf_Addr *)(line_count + (long)line_2._4_4_ * 8);
              local_1d0 = (stacktrace_frame *)0x0;
              local_1d8 = &local_1d0;
              iVar3 = wrap<Dwarf_Line_s_*,_unsigned_long_long_*,_Dwarf_Error_s_**,_Dwarf_Line_s_*&,_unsigned_long_long_*,_0>
                                (this,dwarf_lineaddr,(Dwarf_Line_s **)&lineaddr_1,
                                 (unsigned_long_long **)&local_1d8);
              source_location::source_location
                        ((source_location *)&line_number_1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                         ,800);
              location_04._8_8_ = in_stack_fffffffffffffce0;
              location_04.file = (char *)args_4;
              assert_impl<bool>((detail *)(ulong)(iVar3 == 0),true,0x33e915,
                                "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                                ,(char *)line_number_1,location_04);
              if (frame_local == local_1d0) {
                pDStack_1b8 = (Dwarf_Line_s *)lineaddr_1;
              }
            }
          }
          else if (((pDStack_180 != (Dwarf_Line_s *)0x0) && (last_line < frame_local)) &&
                  (frame_local < local_198)) {
            pDStack_1b8 = pDStack_180;
          }
          if (pDStack_1b8 == (Dwarf_Line_s *)0x0) {
            local_258 = &local_24c;
            iVar3 = wrap<Dwarf_Line_s_*,_int_*,_Dwarf_Error_s_**,_Dwarf_Line_s_*&,_int_*,_0>
                              (this,dwarf_lineendsequence,(Dwarf_Line_s **)&lineaddr,&local_258);
            source_location::source_location
                      (&local_268,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                       ,0x336);
            location_07._8_8_ = in_stack_fffffffffffffce0;
            location_07.file = (char *)args_4;
            assert_impl<bool>((detail *)(ulong)(iVar3 == 0),true,0x33e9ba,
                              "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                              ,local_268.file,location_07);
            if (local_24c == 0) {
              last_line = (Dwarf_Line)local_198;
              pDStack_180 = (Dwarf_Line_s *)lineaddr;
            }
            else {
              last_line = (Dwarf_Line)0x0;
              pDStack_180 = (Dwarf_Line_s *)0x0;
            }
          }
          else {
            local_1f0 = 0;
            local_1f8 = &local_1f0;
            iVar3 = wrap<Dwarf_Line_s_*,_unsigned_long_long_*,_Dwarf_Error_s_**,_Dwarf_Line_s_*&,_unsigned_long_long_*,_0>
                              (this,dwarf_lineno,&stack0xfffffffffffffe48,&local_1f8);
            source_location::source_location
                      ((source_location *)&filename_1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                       ,0x32b);
            location_05._8_8_ = in_stack_fffffffffffffce0;
            location_05.file = (char *)args_4;
            assert_impl<bool>((detail *)(ulong)(iVar3 == 0),true,0x33e948,
                              "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                              ,filename_1,location_05);
            nullable<unsigned_int,_0>::operator=
                      ((nullable<unsigned_int,_0> *)(table_info_opt._8_8_ + 0x10),(uint)local_1f0);
            local_210 = (char *)0x0;
            local_218 = &local_210;
            iVar3 = wrap<Dwarf_Line_s_*,_char_**,_Dwarf_Error_s_**,_Dwarf_Line_s_*&,_char_**,_0>
                              (this,dwarf_linesrc,&stack0xfffffffffffffe48,&local_218);
            source_location::source_location
                      ((source_location *)&wrapper_1.deleter.holds_value,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                       ,0x32e);
            location_06._8_8_ = in_stack_fffffffffffffce0;
            location_06.file = (char *)args_4;
            assert_impl<bool>((detail *)(ulong)(iVar3 == 0),true,0x33e982,
                              "void cpptrace::detail::libdwarf::dwarf_resolver::retrieve_line_info(const die_object &, Dwarf_Addr, stacktrace_frame &)"
                              ,(char *)wrapper_1.deleter._8_8_,location_06);
            pdStack_248 = this;
            raii_wrap<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:817:29),_0,_0>
                      ((raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:817:29),_0,_0,_0>
                        *)local_240,local_210,(anon_class_8_1_8991fb9c_for_uvalue)this);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (table_info_opt._8_8_ + 0x18),local_210);
            raii_wrapper<char_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:817:29),_0,_0,_0>
            ::~raii_wrapper((raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_resolver_cpp:817:29),_0,_0,_0>
                             *)local_240);
          }
        }
      }
    }
    optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0>::~optional
              ((optional<std::reference_wrapper<cpptrace::detail::libdwarf::line_table_info>,_0> *)
               local_38);
  }
  return;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE_FOR_PROFILING
        void retrieve_line_info(
            const die_object& cu_die,
            Dwarf_Addr pc,
            stacktrace_frame& frame
        ) {
            // For debug fission the skeleton debug info will have the line table
            if(skeleton) {
                return skeleton.unwrap().resolver.retrieve_line_info(skeleton.unwrap().cu_die, pc, frame);
            }
            auto table_info_opt = get_line_table(cu_die);
            if(!table_info_opt) {
                return; // failing silently for now
            }
            auto& table_info = table_info_opt.unwrap().get();
            if(get_cache_mode() == cache_mode::prioritize_speed) {
                // Lookup in the table
                auto& line_entries = table_info.line_entries;
                auto table_it = first_less_than_or_equal(
                    line_entries.begin(),
                    line_entries.end(),
                    pc,
                    [] (Dwarf_Addr pc, const line_entry& entry) {
                        return pc < entry.low;
                    }
                );
                // If the vector has been empty this can happen
                if(table_it != line_entries.end()) {
                    Dwarf_Line line = table_it->line;
                    // line number
                    if(!table_it->line_number) {
                        Dwarf_Unsigned line_number = 0;
                        VERIFY(wrap(dwarf_lineno, line, &line_number) == DW_DLV_OK);
                        table_it->line_number = static_cast<std::uint32_t>(line_number);
                    }
                    frame.line = table_it->line_number.unwrap();
                    // column number
                    if(!table_it->column_number) {
                        Dwarf_Unsigned column_number = 0;
                        VERIFY(wrap(dwarf_lineoff_b, line, &column_number) == DW_DLV_OK);
                        table_it->column_number = static_cast<std::uint32_t>(column_number);
                    }
                    frame.column = table_it->column_number.unwrap();
                    // filename
                    if(!table_it->path) {
                        char* filename = nullptr;
                        VERIFY(wrap(dwarf_linesrc, line, &filename) == DW_DLV_OK);
                        auto wrapper = raii_wrap(
                            filename,
                            [this] (char* str) { if(str) dwarf_dealloc(dbg, str, DW_DLA_STRING); }
                        );
                        table_it->path = filename;
                    }
                    frame.filename = table_it->path.unwrap();
                }
            } else {
                Dwarf_Line_Context line_context = table_info.line_context;
                // walk for it
                Dwarf_Line* line_buffer = nullptr;
                Dwarf_Signed line_count = 0;
                Dwarf_Line* linebuf_actuals = nullptr;
                Dwarf_Signed linecount_actuals = 0;
                VERIFY(
                    wrap(
                        dwarf_srclines_two_level_from_linecontext,
                        line_context,
                        &line_buffer,
                        &line_count,
                        &linebuf_actuals,
                        &linecount_actuals
                    ) == DW_DLV_OK
                );
                Dwarf_Addr last_lineaddr = 0;
                Dwarf_Line last_line = nullptr;
                for(int i = 0; i < line_count; i++) {
                    Dwarf_Line line = line_buffer[i];
                    Dwarf_Addr lineaddr = 0;
                    VERIFY(wrap(dwarf_lineaddr, line, &lineaddr) == DW_DLV_OK);
                    Dwarf_Line found_line = nullptr;
                    if(pc == lineaddr) {
                        // Multiple PCs may correspond to a line, find the last one
                        found_line = line;
                        for(int j = i + 1; j < line_count; j++) {
                            Dwarf_Line line = line_buffer[j];
                            Dwarf_Addr lineaddr = 0;
                            VERIFY(wrap(dwarf_lineaddr, line, &lineaddr) == DW_DLV_OK);
                            if(pc == lineaddr) {
                                found_line = line;
                            }
                        }
                    } else if(last_line && pc > last_lineaddr && pc < lineaddr) {
                        // Guess that the last line had it
                        found_line = last_line;
                    }
                    if(found_line) {
                        Dwarf_Unsigned line_number = 0;
                        VERIFY(wrap(dwarf_lineno, found_line, &line_number) == DW_DLV_OK);
                        frame.line = static_cast<std::uint32_t>(line_number);
                        char* filename = nullptr;
                        VERIFY(wrap(dwarf_linesrc, found_line, &filename) == DW_DLV_OK);
                        auto wrapper = raii_wrap(
                            filename,
                            [this] (char* str) { if(str) dwarf_dealloc(dbg, str, DW_DLA_STRING); }
                        );
                        frame.filename = filename;
                    } else {
                        Dwarf_Bool is_line_end;
                        VERIFY(wrap(dwarf_lineendsequence, line, &is_line_end) == DW_DLV_OK);
                        if(is_line_end) {
                            last_lineaddr = 0;
                            last_line = nullptr;
                        } else {
                            last_lineaddr = lineaddr;
                            last_line = line;
                        }
                    }
                }
            }
        }